

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpReg2Aux
               (OpCode op,OpLayoutReg2Aux *playout,FunctionBody *dumpFunction,ByteCodeReader *reader
               )

{
  code *pcVar1;
  bool bVar2;
  AuxArray<unsigned_int> *pAVar3;
  undefined4 *puVar4;
  uint local_34;
  uint i;
  AuxArray<unsigned_int> *arr;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutReg2Aux *playout_local;
  OpCode op_local;
  
  if (op == SpreadArrayLiteral) {
    pAVar3 = ByteCodeReader::ReadAuxArray<unsigned_int>
                       ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,
                        dumpFunction);
    Output::Print(L" R%u <- R%u, %u spreadArgs [",(ulong)(playout->super_OpLayoutAuxiliary).R0,
                  (ulong)playout->R1,(ulong)pAVar3->count);
    for (local_34 = 0; local_34 < pAVar3->count; local_34 = local_34 + 1) {
      if (10 < local_34) {
        Output::Print(L", ...");
        break;
      }
      if (local_34 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%u",(ulong)pAVar3[(ulong)local_34 + 1].count);
    }
    Output::Print(L"]");
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x62a,"(false)","Unknown OpCode for OpLayoutType::Reg2Aux");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg2Aux(OpCode op, const unaligned OpLayoutReg2Aux * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case Js::OpCode::SpreadArrayLiteral:
        {
            const Js::AuxArray<uint32> *arr = reader.ReadAuxArray<uint32>(playout->Offset, dumpFunction);
            Output::Print(_u(" R%u <- R%u, %u spreadArgs ["), playout->R0, playout->R1, arr->count);
            for (uint i = 0; i < arr->count; i++)
            {
                if (i > 10)
                {
                    Output::Print(_u(", ..."));
                    break;
                }
                if (i != 0)
                {
                    Output::Print(_u(", "));
                }
                Output::Print(_u("%u"), arr->elements[i]);
            }
            Output::Print(_u("]"));
            break;
        }
        default:
            AssertMsg(false, "Unknown OpCode for OpLayoutType::Reg2Aux");
            break;
        }
    }